

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathCompPathExpr(xmlXPathParserContextPtr ctxt)

{
  xmlChar xVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  xmlXPathObjectPtr pxVar5;
  xmlChar *str;
  byte bVar6;
  byte *pbVar7;
  xmlChar *pxVar8;
  uint uVar9;
  byte *pbVar10;
  int iVar11;
  byte *pbVar12;
  byte bVar13;
  long lVar14;
  bool bVar15;
  double dVar16;
  void *pvVar17;
  undefined8 local_48;
  void *local_40;
  double local_38;
  
  pbVar12 = ctxt->cur;
  while( true ) {
    pbVar7 = pbVar12 + 1;
    bVar6 = *pbVar12;
    uVar4 = (ulong)bVar6;
    if (0x28 < uVar4) break;
    if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
      if ((0x11000000000U >> (uVar4 & 0x3f) & 1) != 0) goto switchD_001e28be_caseD_27;
      break;
    }
    ctxt->cur = pbVar7;
    pbVar12 = pbVar7;
  }
  if ((byte)(bVar6 - 0x30) < 10) goto switchD_001e28be_caseD_27;
  switch(bVar6) {
  case 0x27:
    break;
  case 0x28:
  case 0x29:
  case 0x2b:
  case 0x2c:
  case 0x2d:
switchD_001e28be_caseD_28:
    pbVar12 = ctxt->cur;
    while( true ) {
      if ((0x20 < (ulong)*pbVar12) || ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar12 + 1;
      pbVar12 = pbVar12 + 1;
    }
    pxVar8 = ctxt->cur;
    uVar3 = xmlXPathCurrentChar(ctxt,(int *)&local_48);
    if ((uVar3 < 0x3f) && ((0x4000800100000000U >> ((ulong)uVar3 & 0x3f) & 1) != 0))
    goto LAB_001e2c4f;
    if (uVar3 < 0x100) {
      if ((uVar3 - 0xc0 < 0x17 || (uVar3 & 0xdf) - 0x41 < 0x1a) ||
         (0xf7 < uVar3 || uVar3 - 0xd8 < 0x1f)) goto LAB_001e3117;
LAB_001e342a:
      if (uVar3 < 0x100) {
        if (((char)uVar3 == '_') || ((uVar3 & 0xff) == 0x3a)) goto LAB_001e3117;
      }
      else if ((uVar3 - 0x3021 < 9 || uVar3 - 0x4e00 < 0x51a6) || uVar3 == 0x3007)
      goto LAB_001e3117;
LAB_001e2c4f:
      str = (xmlChar *)0x0;
    }
    else {
      iVar11 = xmlCharInRange(uVar3,&xmlIsBaseCharGroup);
      if (iVar11 == 0) goto LAB_001e342a;
LAB_001e3117:
      while ((0x3e < uVar3 || ((0x4000800100000000U >> ((ulong)uVar3 & 0x3f) & 1) == 0))) {
        if (uVar3 < 0x100) {
          if ((0x16 < uVar3 - 0xc0 && 0x19 < (uVar3 & 0xdf) - 0x41) &&
             (uVar3 < 0xf8 && 0x1e < uVar3 - 0xd8)) {
LAB_001e318e:
            if (uVar3 < 0x100) {
              if (9 < uVar3 - 0x30) {
LAB_001e31e1:
                if ((0x32 < uVar3 - 0x2d) ||
                   ((0x4000000002003U >> ((ulong)(uVar3 - 0x2d) & 0x3f) & 1) == 0)) {
                  if (uVar3 < 0x100) {
                    uVar3 = (uint)(uVar3 == 0xb7);
                  }
                  else {
                    iVar11 = xmlCharInRange(uVar3,&xmlIsCombiningGroup);
                    if (iVar11 != 0) goto LAB_001e31fa;
                    uVar3 = xmlCharInRange(uVar3,&xmlIsExtenderGroup);
                  }
                  if (uVar3 == 0) break;
                }
              }
            }
            else if (((8 < uVar3 - 0x3021 && 0x51a5 < uVar3 - 0x4e00) && uVar3 != 0x3007) &&
                    (iVar11 = xmlCharInRange(uVar3,&xmlIsDigitGroup), iVar11 == 0))
            goto LAB_001e31e1;
          }
        }
        else {
          iVar11 = xmlCharInRange(uVar3,&xmlIsBaseCharGroup);
          if (iVar11 == 0) goto LAB_001e318e;
        }
LAB_001e31fa:
        ctxt->cur = ctxt->cur + (int)local_48;
        uVar3 = xmlXPathCurrentChar(ctxt,(int *)&local_48);
      }
      str = xmlStrndup(pxVar8,*(int *)&ctxt->cur - (int)pxVar8);
      ctxt->cur = pxVar8;
    }
    if (str == (xmlChar *)0x0) {
      xmlXPathErr(ctxt,7);
      return;
    }
    pxVar8 = xmlStrstr(str,(xmlChar *)"::");
    if (pxVar8 == (xmlChar *)0x0) {
      iVar11 = xmlStrlen(str);
      lVar14 = (long)iVar11;
      do {
        xVar1 = ctxt->cur[lVar14];
        if (xVar1 != ' ') {
          bVar15 = false;
          if ((xVar1 == '\0') || (bVar15 = false, xVar1 == '/')) goto LAB_001e349d;
          if ((1 < (byte)(xVar1 - 9)) && (xVar1 != '\r')) goto LAB_001e344f;
        }
        lVar14 = lVar14 + 1;
      } while( true );
    }
    (*xmlFree)(str);
  case 0x2a:
  case 0x2f:
switchD_001e28be_caseD_2a:
    xmlXPathCompExprAdd(ctxt,-1,-1,*ctxt->cur == '/' ^ XPATH_OP_NODE,0,0,0,(void *)0x0,(void *)0x0);
    pbVar12 = ctxt->cur;
    while( true ) {
      uVar4 = (ulong)*pbVar12;
      if (0x2f < uVar4) break;
      if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
        if (uVar4 == 0x2f) goto LAB_001e32fc;
        break;
      }
      ctxt->cur = pbVar12 + 1;
      pbVar12 = pbVar12 + 1;
    }
    goto LAB_001e33a7;
  case 0x2e:
    if (9 < (byte)(*pbVar7 - 0x30)) {
      if ((0x16 < bVar6 - 0x2a) || ((0x400031U >> (bVar6 - 0x2a & 0x1f) & 1) == 0))
      goto switchD_001e28be_caseD_28;
      goto switchD_001e28be_caseD_2a;
    }
    break;
  default:
    if (bVar6 != 0x22) {
      if (bVar6 != 0x40) goto switchD_001e28be_caseD_28;
      goto switchD_001e28be_caseD_2a;
    }
  }
switchD_001e28be_caseD_27:
  pbVar7 = ctxt->cur + 1;
  pbVar12 = pbVar7;
  while( true ) {
    bVar6 = pbVar12[-1];
    uVar4 = (ulong)bVar6;
    if (0x28 < uVar4) break;
    if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
      if (uVar4 == 0x24) goto LAB_001e2771;
      if (uVar4 == 0x28) goto LAB_001e274c;
      break;
    }
    ctxt->cur = pbVar12;
    pbVar12 = pbVar12 + 1;
    pbVar7 = pbVar7 + 1;
  }
  bVar13 = bVar6 - 0x30;
  if (bVar13 < 10) {
LAB_001e2832:
    if (ctxt->error == 0) {
      if (bVar6 != 0x2e && (byte)(bVar6 - 0x3a) < 0xf6) {
        iVar11 = 1;
        goto LAB_001e29c7;
      }
      if (bVar13 < 10) {
        pvVar17 = (void *)0x0;
        do {
          ctxt->cur = pbVar12;
          pvVar17 = (void *)((double)((byte)uVar4 & 0xf) + (double)pvVar17 * 10.0);
          bVar6 = *pbVar12;
          uVar4 = (ulong)bVar6;
          pbVar12 = pbVar12 + 1;
        } while ((byte)(bVar6 - 0x30) < 10);
      }
      else {
        pvVar17 = (void *)0x0;
      }
      if (bVar6 == 0x2e) {
        ctxt->cur = pbVar12;
        bVar6 = *pbVar12;
        local_40 = pvVar17;
        if (bVar6 < 0x30) {
          if (bVar13 < 10) goto LAB_001e2e55;
LAB_001e2e3b:
          xmlXPathErr(ctxt,1);
          bVar15 = false;
          pvVar17 = local_40;
        }
        else {
          if ((9 < bVar13) && (0x39 < bVar6)) goto LAB_001e2e3b;
LAB_001e2e55:
          uVar4 = 0;
          if (bVar6 == 0x30) {
            uVar4 = 0;
            do {
              ctxt->cur = pbVar12 + uVar4 + 1;
              lVar14 = uVar4 + 1;
              uVar4 = uVar4 + 1;
            } while (pbVar12[lVar14] == 0x30);
          }
          uVar3 = (uint)uVar4;
          pbVar12 = ctxt->cur;
          bVar6 = *pbVar12;
          local_38 = 0.0;
          if ((byte)(bVar6 - 0x30) < 10) {
            uVar9 = uVar3 + 0x14;
            do {
              pbVar12 = pbVar12 + 1;
              local_38 = local_38 * 10.0 + (double)(int)(bVar6 - 0x30);
              uVar3 = (int)uVar4 + 1;
              uVar4 = (ulong)uVar3;
              ctxt->cur = pbVar12;
              bVar6 = *pbVar12;
              if (9 < (byte)(bVar6 - 0x30)) break;
            } while (uVar3 < uVar9);
          }
          dVar16 = pow(10.0,(double)(int)uVar3);
          pxVar8 = ctxt->cur;
          bVar15 = true;
          xVar1 = *pxVar8;
          while (pvVar17 = (void *)((double)local_40 + local_38 / dVar16), (byte)(xVar1 - 0x30) < 10
                ) {
            pxVar8 = pxVar8 + 1;
            ctxt->cur = pxVar8;
            xVar1 = *pxVar8;
          }
        }
        if (!bVar15) goto LAB_001e29cc;
      }
      pbVar12 = ctxt->cur;
      if ((*pbVar12 | 0x20) == 0x65) {
        ctxt->cur = pbVar12 + 1;
        bVar6 = pbVar12[1];
        if ((bVar6 == 0x2d) || (bVar6 == 0x2b)) {
          ctxt->cur = pbVar12 + 2;
        }
        pbVar12 = ctxt->cur;
        bVar13 = *pbVar12;
        iVar11 = 0;
        if ((byte)(bVar13 - 0x30) < 10) {
          iVar11 = 0;
          do {
            pbVar12 = pbVar12 + 1;
            iVar2 = (bVar13 - 0x30) + iVar11 * 10;
            if (999999 < iVar11) {
              iVar2 = iVar11;
            }
            iVar11 = iVar2;
            ctxt->cur = pbVar12;
            bVar13 = *pbVar12;
          } while ((byte)(bVar13 - 0x30) < 10);
        }
        iVar2 = -iVar11;
        if (bVar6 != 0x2d) {
          iVar2 = iVar11;
        }
        local_40 = pvVar17;
        dVar16 = pow(10.0,(double)iVar2);
        pvVar17 = (void *)((double)local_40 * dVar16);
      }
      pxVar5 = xmlXPathCacheNewFloat(ctxt->context,(double)pvVar17);
      if (pxVar5 == (xmlXPathObjectPtr)0x0) {
        ctxt->error = 0xf;
      }
      else {
        iVar11 = xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_VALUE,3,0,0,pxVar5,
                                     (void *)0x0);
        if (iVar11 == -1) {
          xmlXPathReleaseObject(ctxt->context,pxVar5);
        }
      }
    }
  }
  else {
    pbVar10 = pbVar12;
    if (bVar6 == 0x22) {
      while( true ) {
        ctxt->cur = pbVar10;
        bVar6 = *pbVar10;
        uVar3 = (uint)bVar6;
        uVar9 = (uint)bVar6;
        bVar13 = bVar6 - 9;
        do {
          if (bVar6 < 0x20) {
            uVar3 = uVar9;
            if ((0xd < uVar9) || ((0x2600U >> (uVar9 & 0x1f) & 1) == 0)) goto LAB_001e2af7;
            goto LAB_001e295e;
          }
        } while (uVar9 == 0);
        if (uVar9 == 0x22) break;
LAB_001e295e:
        pbVar10 = pbVar10 + 1;
      }
    }
    else {
      if (bVar6 != 0x27) {
        if ((bVar6 == 0x2e) && ((byte)(*pbVar12 - 0x30) < 10)) goto LAB_001e2832;
        pxVar8 = xmlXPathParseQName(ctxt,(xmlChar **)&local_48);
        if (pxVar8 == (xmlChar *)0x0) {
          (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
        }
        else {
          pbVar12 = ctxt->cur;
          while( true ) {
            pbVar7 = pbVar12 + 1;
            uVar4 = (ulong)*pbVar12;
            if (0x28 < uVar4) break;
            if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
              if (uVar4 == 0x28) goto LAB_001e2c6e;
              break;
            }
            ctxt->cur = pbVar7;
            pbVar12 = pbVar7;
          }
          (*xmlFree)(pxVar8);
          (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
        }
        iVar11 = 7;
        goto LAB_001e29c7;
      }
      while( true ) {
        ctxt->cur = pbVar10;
        bVar6 = *pbVar10;
        uVar3 = (uint)bVar6;
        bVar13 = bVar6 - 9;
        do {
          if (bVar6 < 0x20) {
            if ((0xd < uVar3) || ((0x2600U >> (uVar3 & 0x1f) & 1) == 0)) goto LAB_001e2af7;
            goto LAB_001e2af2;
          }
        } while (uVar3 == 0);
        if (uVar3 == 0x27) break;
LAB_001e2af2:
        pbVar10 = pbVar10 + 1;
      }
    }
LAB_001e2af7:
    if ((bVar13 < 2) || (0x1f < (byte)uVar3 || uVar3 == 0xd)) {
      pxVar8 = xmlStrndup(pbVar12,(int)pbVar10 - (int)pbVar7);
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
      if (pxVar8 != (xmlChar *)0x0) {
        pxVar5 = xmlXPathCacheNewString(ctxt->context,pxVar8);
        if (pxVar5 == (xmlXPathObjectPtr)0x0) {
          ctxt->error = 0xf;
        }
        else {
          iVar11 = xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_VALUE,4,0,0,pxVar5,
                                       (void *)0x0);
          if (iVar11 == -1) {
            xmlXPathReleaseObject(ctxt->context,pxVar5);
          }
        }
        (*xmlFree)(pxVar8);
      }
    }
    else {
      iVar11 = 2;
LAB_001e29c7:
      xmlXPathErr(ctxt,iVar11);
    }
  }
LAB_001e29cc:
  pbVar12 = ctxt->cur;
  while( true ) {
    if ((0x20 < (ulong)*pbVar12) || ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0)) break;
    ctxt->cur = pbVar12 + 1;
    pbVar12 = pbVar12 + 1;
  }
LAB_001e29f4:
  if (ctxt->error == 0) {
    pbVar12 = ctxt->cur;
    while( true ) {
      if ((0x20 < (ulong)*pbVar12) || ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar12 + 1;
      pbVar12 = pbVar12 + 1;
    }
    while (*ctxt->cur == '[') {
      xmlXPathCompPredicate(ctxt,1);
      pbVar12 = ctxt->cur;
      while( true ) {
        if ((0x20 < (ulong)*pbVar12) || ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0))
        break;
        ctxt->cur = pbVar12 + 1;
        pbVar12 = pbVar12 + 1;
      }
    }
  }
  if (ctxt->error == 0) {
    pxVar8 = ctxt->cur;
    if (*pxVar8 == '/') {
      if (pxVar8[1] == '/') {
        pbVar12 = pxVar8 + 2;
        while( true ) {
          ctxt->cur = pbVar12;
          if ((0x20 < (ulong)*pbVar12) || ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0))
          break;
          pbVar12 = pbVar12 + 1;
        }
        xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,6,1,0,(void *)0x0,(void *)0x0)
        ;
      }
LAB_001e33a7:
      xmlXPathCompRelativeLocationPath(ctxt);
    }
LAB_001e33af:
    pbVar12 = ctxt->cur;
    while( true ) {
      if ((0x20 < (ulong)*pbVar12) || ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar12 + 1;
      pbVar12 = pbVar12 + 1;
    }
  }
  return;
LAB_001e344f:
  if (xVar1 == '(') {
    iVar11 = xmlXPathIsNodeType(str);
    bVar15 = iVar11 == 0;
  }
  else {
    bVar15 = false;
  }
LAB_001e349d:
  xVar1 = ctxt->cur[lVar14];
  (*xmlFree)(str);
  if ((xVar1 == '\0') || (!bVar15)) goto switchD_001e28be_caseD_2a;
  goto switchD_001e28be_caseD_27;
LAB_001e32fc:
  do {
    pbVar12 = ctxt->cur;
    if (*pbVar12 != 0x2f) break;
    if (pbVar12[1] == 0x2f) {
      pbVar12 = pbVar12 + 2;
      while( true ) {
        ctxt->cur = pbVar12;
        if ((0x20 < (ulong)*pbVar12) || ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0))
        break;
        pbVar12 = pbVar12 + 1;
      }
      xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,6,1,0,(void *)0x0,(void *)0x0);
LAB_001e3393:
      xmlXPathCompRelativeLocationPath(ctxt);
    }
    else {
      do {
        pbVar12 = pbVar12 + 1;
        ctxt->cur = pbVar12;
        bVar6 = *pbVar12;
        uVar4 = (ulong)bVar6;
        if (0x20 < uVar4) goto LAB_001e3343;
      } while ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0);
      if (uVar4 != 0) {
LAB_001e3343:
        if (((byte)((bVar6 & 0xdf) + 0xbf) < 0x1a) ||
           ((bVar6 - 0x2a < 0x36 && ((0x20000000400011U >> ((ulong)(bVar6 - 0x2a) & 0x3f) & 1) != 0)
            ))) goto LAB_001e3393;
      }
    }
  } while (ctxt->error == 0);
  goto LAB_001e33af;
LAB_001e2771:
  uVar4 = (ulong)pbVar12[-1];
  if (uVar4 < 0x25) {
    if ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0) goto LAB_001e276b;
    if (uVar4 == 0x24) {
      ctxt->cur = pbVar12;
      pxVar8 = xmlXPathParseQName(ctxt,(xmlChar **)&local_48);
      if (pxVar8 != (xmlChar *)0x0) {
        ctxt->comp->last = -1;
        iVar11 = xmlXPathCompExprAdd(ctxt,-1,-1,XPATH_OP_VARIABLE,0,0,0,pxVar8,
                                     (void *)CONCAT44(local_48._4_4_,(int)local_48));
        if (iVar11 == -1) {
          (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
          (*xmlFree)(pxVar8);
        }
        pbVar12 = ctxt->cur;
        while( true ) {
          if ((0x20 < (ulong)*pbVar12) || ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0))
          break;
          ctxt->cur = pbVar12 + 1;
          pbVar12 = pbVar12 + 1;
        }
        if ((ctxt->context != (xmlXPathContextPtr)0x0) &&
           (iVar11 = 0x18, (ctxt->context->flags & 2) != 0)) goto LAB_001e29c7;
        goto LAB_001e29cc;
      }
      (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
    }
  }
  goto LAB_001e29bf;
LAB_001e276b:
  ctxt->cur = pbVar12;
  pbVar12 = pbVar12 + 1;
  goto LAB_001e2771;
LAB_001e29bf:
  iVar11 = 4;
  goto LAB_001e29c7;
LAB_001e274c:
  while( true ) {
    ctxt->cur = pbVar12;
    if ((0x20 < (ulong)*pbVar12) || ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0)) break;
    pbVar12 = pbVar12 + 1;
  }
  xmlXPathCompileExpr(ctxt,1);
  if (ctxt->error == 0) {
    pbVar12 = ctxt->cur;
    if (*pbVar12 == 0x29) {
      do {
        pbVar12 = pbVar12 + 1;
        ctxt->cur = pbVar12;
        if (0x20 < (ulong)*pbVar12) break;
      } while ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0);
      goto LAB_001e29cc;
    }
    xmlXPathErr(ctxt,7);
  }
  goto LAB_001e29f4;
LAB_001e2c6e:
  while( true ) {
    ctxt->cur = pbVar7;
    if ((0x20 < (ulong)*pbVar7) || ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) == 0)) break;
    pbVar7 = pbVar7 + 1;
  }
  local_40 = (void *)CONCAT44(local_48._4_4_,(int)local_48);
  uVar3 = 1;
  if ((local_40 == (void *)0x0) && (*pxVar8 == 'c')) {
    iVar11 = xmlStrEqual(pxVar8,(xmlChar *)"count");
    uVar3 = (uint)(iVar11 == 0);
  }
  ctxt->comp->last = -1;
  iVar11 = 0;
  if (*ctxt->cur == ')') {
LAB_001e3082:
    pvVar17 = local_40;
    iVar11 = xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_FUNCTION,iVar11,0,0,pxVar8,
                                 local_40);
    if (iVar11 == -1) {
      (*xmlFree)(pvVar17);
      (*xmlFree)(pxVar8);
    }
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    pbVar12 = ctxt->cur;
    while( true ) {
      if ((0x20 < (ulong)*pbVar12) || ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar12 + 1;
      pbVar12 = pbVar12 + 1;
    }
  }
  else {
    iVar11 = 0;
    do {
      if (*ctxt->cur == '\0') goto LAB_001e3082;
      iVar2 = ctxt->comp->last;
      ctxt->comp->last = -1;
      xmlXPathCompileExpr(ctxt,uVar3);
      if (ctxt->error == 0) {
        xmlXPathCompExprAdd(ctxt,iVar2,ctxt->comp->last,XPATH_OP_ARG,0,0,0,(void *)0x0,(void *)0x0);
        iVar11 = iVar11 + 1;
        pbVar12 = ctxt->cur;
        if (*pbVar12 == 0x29) {
          iVar2 = 7;
        }
        else {
          if (*pbVar12 != 0x2c) {
            (*xmlFree)(pxVar8);
            (*xmlFree)(local_40);
            xmlXPathErr(ctxt,7);
            goto LAB_001e2d77;
          }
          do {
            pbVar12 = pbVar12 + 1;
            ctxt->cur = pbVar12;
            if (0x20 < (ulong)*pbVar12) break;
          } while ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0);
          iVar2 = 0;
        }
      }
      else {
        (*xmlFree)(pxVar8);
        (*xmlFree)(local_40);
LAB_001e2d77:
        iVar2 = 1;
      }
    } while (iVar2 == 0);
    if (iVar2 == 7) goto LAB_001e3082;
  }
  goto LAB_001e29cc;
}

Assistant:

static void
xmlXPathCompPathExpr(xmlXPathParserContextPtr ctxt) {
    int lc = 1;           /* Should we branch to LocationPath ?         */
    xmlChar *name = NULL; /* we may have to preparse a name to find out */

    SKIP_BLANKS;
    if ((CUR == '$') || (CUR == '(') ||
	(IS_ASCII_DIGIT(CUR)) ||
        (CUR == '\'') || (CUR == '"') ||
	(CUR == '.' && IS_ASCII_DIGIT(NXT(1)))) {
	lc = 0;
    } else if (CUR == '*') {
	/* relative or absolute location path */
	lc = 1;
    } else if (CUR == '/') {
	/* relative or absolute location path */
	lc = 1;
    } else if (CUR == '@') {
	/* relative abbreviated attribute location path */
	lc = 1;
    } else if (CUR == '.') {
	/* relative abbreviated attribute location path */
	lc = 1;
    } else {
	/*
	 * Problem is finding if we have a name here whether it's:
	 *   - a nodetype
	 *   - a function call in which case it's followed by '('
	 *   - an axis in which case it's followed by ':'
	 *   - a element name
	 * We do an a priori analysis here rather than having to
	 * maintain parsed token content through the recursive function
	 * calls. This looks uglier but makes the code easier to
	 * read/write/debug.
	 */
	SKIP_BLANKS;
	name = xmlXPathScanName(ctxt);
	if ((name != NULL) && (xmlStrstr(name, (xmlChar *) "::") != NULL)) {
#ifdef DEBUG_STEP
	    xmlGenericError(xmlGenericErrorContext,
		    "PathExpr: Axis\n");
#endif
	    lc = 1;
	    xmlFree(name);
	} else if (name != NULL) {
	    int len =xmlStrlen(name);


	    while (NXT(len) != 0) {
		if (NXT(len) == '/') {
		    /* element name */
#ifdef DEBUG_STEP
		    xmlGenericError(xmlGenericErrorContext,
			    "PathExpr: AbbrRelLocation\n");
#endif
		    lc = 1;
		    break;
		} else if (IS_BLANK_CH(NXT(len))) {
		    /* ignore blanks */
		    ;
		} else if (NXT(len) == ':') {
#ifdef DEBUG_STEP
		    xmlGenericError(xmlGenericErrorContext,
			    "PathExpr: AbbrRelLocation\n");
#endif
		    lc = 1;
		    break;
		} else if ((NXT(len) == '(')) {
		    /* Node Type or Function */
		    if (xmlXPathIsNodeType(name)) {
#ifdef DEBUG_STEP
		        xmlGenericError(xmlGenericErrorContext,
				"PathExpr: Type search\n");
#endif
			lc = 1;
#ifdef LIBXML_XPTR_LOCS_ENABLED
                    } else if (ctxt->xptr &&
                               xmlStrEqual(name, BAD_CAST "range-to")) {
                        lc = 1;
#endif
		    } else {
#ifdef DEBUG_STEP
		        xmlGenericError(xmlGenericErrorContext,
				"PathExpr: function call\n");
#endif
			lc = 0;
		    }
                    break;
		} else if ((NXT(len) == '[')) {
		    /* element name */
#ifdef DEBUG_STEP
		    xmlGenericError(xmlGenericErrorContext,
			    "PathExpr: AbbrRelLocation\n");
#endif
		    lc = 1;
		    break;
		} else if ((NXT(len) == '<') || (NXT(len) == '>') ||
			   (NXT(len) == '=')) {
		    lc = 1;
		    break;
		} else {
		    lc = 1;
		    break;
		}
		len++;
	    }
	    if (NXT(len) == 0) {
#ifdef DEBUG_STEP
		xmlGenericError(xmlGenericErrorContext,
			"PathExpr: AbbrRelLocation\n");
#endif
		/* element name */
		lc = 1;
	    }
	    xmlFree(name);
	} else {
	    /* make sure all cases are covered explicitly */
	    XP_ERROR(XPATH_EXPR_ERROR);
	}
    }

    if (lc) {
	if (CUR == '/') {
	    PUSH_LEAVE_EXPR(XPATH_OP_ROOT, 0, 0);
	} else {
	    PUSH_LEAVE_EXPR(XPATH_OP_NODE, 0, 0);
	}
	xmlXPathCompLocationPath(ctxt);
    } else {
	xmlXPathCompFilterExpr(ctxt);
	CHECK_ERROR;
	if ((CUR == '/') && (NXT(1) == '/')) {
	    SKIP(2);
	    SKIP_BLANKS;

	    PUSH_LONG_EXPR(XPATH_OP_COLLECT, AXIS_DESCENDANT_OR_SELF,
		    NODE_TEST_TYPE, NODE_TYPE_NODE, NULL, NULL);

	    xmlXPathCompRelativeLocationPath(ctxt);
	} else if (CUR == '/') {
	    xmlXPathCompRelativeLocationPath(ctxt);
	}
    }
    SKIP_BLANKS;
}